

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Finger.cpp
# Opt level: O1

void __thiscall Finger::stabilize(Finger *this,Filter *f)

{
  vector<float,_std::allocator<float>_> prd;
  vector<float,_std::allocator<float>_> local_28;
  
  Filter::predict(&local_28,f);
  (this->ptStart).x =
       (int)*local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->ptStart).y =
       (int)local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[1];
  (this->ptEnd).x =
       (int)local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[2];
  (this->ptEnd).y =
       (int)local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[3];
  (this->ptFar).x =
       (int)local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[4];
  (this->ptFar).y =
       (int)local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[5];
  operator_delete(local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return;
}

Assistant:

void Finger::stabilize(Filter &f) {
    vector<float> prd = f.predict();
    ptStart.x = prd[0];
    ptStart.y = prd[1];
    ptEnd.x = prd[2];
    ptEnd.y = prd[3];
    ptFar.x = prd[4];
    ptFar.y = prd[5];
}